

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

void __thiscall Fl_Browser_::new_list(Fl_Browser_ *this)

{
  Fl_Browser_ *this_local;
  
  this->top_ = (void *)0x0;
  this->real_position_ = 0;
  this->position_ = 0;
  this->real_hposition_ = 0;
  this->hposition_ = 0;
  this->selection_ = (void *)0x0;
  this->offset_ = 0;
  this->max_width = 0;
  this->max_width_item = (void *)0x0;
  redraw_lines(this);
  return;
}

Assistant:

void Fl_Browser_::new_list() {
  top_ = 0;
  position_ = real_position_ = 0;
  hposition_ = real_hposition_ = 0;
  selection_ = 0;
  offset_ = 0;
  max_width = 0;
  max_width_item = 0;
  redraw_lines();
}